

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

char * __thiscall CStorage::ReadFileStr(CStorage *this,char *pFilename,int Type)

{
  long lVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  char *pResult;
  IOHANDLE File;
  IOHANDLE io;
  undefined8 local_8;
  
  io = (IOHANDLE)0x0;
  lVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_RSI,9,in_EDX,0,0,0);
  if (lVar1 == 0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = io_read_all_str(io);
    io_close((IOHANDLE)0x15ec57);
  }
  return local_8;
}

Assistant:

char *ReadFileStr(const char *pFilename, int Type)
	{
		IOHANDLE File = OpenFile(pFilename, IOFLAG_READ | IOFLAG_SKIP_BOM, Type);
		if(!File)
		{
			return 0;
		}
		char *pResult = io_read_all_str(File);
		io_close(File);
		return pResult;
	}